

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

void setup_pred_plane(buf_2d *dst,BLOCK_SIZE bsize,uint8_t *src,int width,int height,int stride,
                     int mi_row,int mi_col,scale_factors *scale,int subsampling_x,int subsampling_y)

{
  int64_t iVar1;
  int in_ECX;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  int y;
  int x;
  int in_stack_00000028;
  undefined4 in_stack_ffffffffffffffd0;
  
  if (((in_stack_00000028 != 0) && ((in_stack_00000008 & 1) != 0)) &&
     ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_SIL] == '\x01'
     )) {
    in_stack_00000008 = in_stack_00000008 - 1;
  }
  iVar1 = scaled_buffer_offset
                    (in_ECX,in_R8D,in_R9D,
                     (scale_factors *)
                     CONCAT44((int)(in_stack_00000008 << 2) >> ((byte)in_stack_00000028 & 0x1f),
                              in_stack_ffffffffffffffd0));
  *in_RDI = in_RDX + iVar1;
  in_RDI[1] = in_RDX;
  *(int *)(in_RDI + 2) = in_ECX;
  *(int *)((long)in_RDI + 0x14) = in_R8D;
  *(int *)(in_RDI + 3) = in_R9D;
  return;
}

Assistant:

static inline void setup_pred_plane(struct buf_2d *dst, BLOCK_SIZE bsize,
                                    uint8_t *src, int width, int height,
                                    int stride, int mi_row, int mi_col,
                                    const struct scale_factors *scale,
                                    int subsampling_x, int subsampling_y) {
  // Offset the buffer pointer
  if (subsampling_y && (mi_row & 0x01) && (mi_size_high[bsize] == 1))
    mi_row -= 1;
  if (subsampling_x && (mi_col & 0x01) && (mi_size_wide[bsize] == 1))
    mi_col -= 1;

  const int x = (MI_SIZE * mi_col) >> subsampling_x;
  const int y = (MI_SIZE * mi_row) >> subsampling_y;
  dst->buf = src + scaled_buffer_offset(x, y, stride, scale);
  dst->buf0 = src;
  dst->width = width;
  dst->height = height;
  dst->stride = stride;
}